

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ChannelList::layers
          (ChannelList *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *layerNames)

{
  bool bVar1;
  value_type *__x;
  undefined1 *puVar2;
  undefined1 *puVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  size_t pos;
  string layerName;
  ConstIterator i;
  ChannelList *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 local_41 [33];
  const_iterator local_20;
  const_iterator local_18;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x855dd1);
  local_18._M_node = (_Base_ptr)begin(in_stack_ffffffffffffff58);
  while( true ) {
    local_20._M_node = (_Base_ptr)end(in_stack_ffffffffffffff58);
    bVar1 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                                (ConstIterator *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __x = (value_type *)ConstIterator::name((ConstIterator *)0x855e20);
    this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98),
               (allocator<char> *)in_stack_ffffffffffffff90._M_node);
    std::allocator<char>::~allocator((allocator<char> *)local_41);
    in_stack_ffffffffffffffa0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::rfind((char)local_41 + '\x01',0x2e);
    if ((in_stack_ffffffffffffffa0 !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) &&
       (in_stack_ffffffffffffffa0 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      puVar2 = &in_stack_ffffffffffffffa0->field_0x1;
      puVar3 = (undefined1 *)std::__cxx11::string::size();
      if (puVar2 < puVar3) {
        std::__cxx11::string::erase((ulong)(local_41 + 1),(ulong)in_stack_ffffffffffffffa0);
        pVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(this_00,__x);
        in_stack_ffffffffffffff90 = pVar4.first._M_node;
        in_stack_ffffffffffffff67 = pVar4.second;
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff67;
      }
    }
    std::__cxx11::string::~string((string *)(local_41 + 1));
    ConstIterator::operator++
              ((ConstIterator *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  return;
}

Assistant:

void
ChannelList::layers (set <string> &layerNames) const
{
    layerNames.clear();

    for (ConstIterator i = begin(); i != end(); ++i)
    {
	string layerName = i.name();
	size_t pos = layerName.rfind ('.');

	if (pos != string::npos && pos != 0 && pos + 1 < layerName.size())
	{
	    layerName.erase (pos);
	    layerNames.insert (layerName);
	}
    }
}